

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnStructType
          (BinaryReaderLogging *this,Index index,Index field_count,TypeMut *fields)

{
  Enum EVar1;
  ulong uVar2;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnStructType(index: %u, fields: ",index);
  Stream::Writef(this->stream_,"[");
  for (uVar2 = 0; field_count != uVar2; uVar2 = uVar2 + 1) {
    LogField(this,fields[uVar2]);
    if (field_count - 1 != uVar2) {
      Stream::Writef(this->stream_,", ");
    }
  }
  Stream::Writef(this->stream_,"])\n");
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0xc])
                    (this->reader_,(ulong)index,(ulong)field_count,fields);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnStructType(Index index,
                                         Index field_count,
                                         TypeMut* fields) {
  LOGF("OnStructType(index: %" PRIindex ", fields: ", index);
  LOGF_NOINDENT("[");
  for (Index i = 0; i < field_count; ++i) {
    LogField(fields[i]);
    if (i != field_count - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("])\n");
  return reader_->OnStructType(index, field_count, fields);
}